

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taylor.hpp
# Opt level: O3

taylor<double,_2,_12> *
operator+(taylor<double,_2,_12> *__return_storage_ptr__,taylor<double,_2,_12> *t1,
         taylor<double,_2,_12> *t2)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  taylor<double,_2,_12> *ptVar4;
  int i;
  int i_00;
  
  i_00 = 0;
  memset(__return_storage_ptr__,0,0x2d8);
  do {
    pdVar3 = taylor<double,_2,_12>::operator[](t1,i_00);
    dVar1 = *pdVar3;
    pdVar3 = taylor<double,_2,_12>::operator[](t2,i_00);
    dVar2 = *pdVar3;
    ptVar4 = (taylor<double,_2,_12> *)taylor<double,_2,_12>::operator[](__return_storage_ptr__,i_00)
    ;
    (ptVar4->super_polynomial<double,_2,_12>).c[0] = dVar1 + dVar2;
    i_00 = i_00 + 1;
  } while (i_00 != 0x5b);
  return ptVar4;
}

Assistant:

static taylor<T, Nvar, Ndeg> operator+(const taylor<T, Nvar, Ndeg> & t1,
                                       const taylor<T, Nvar, Ndeg> & t2) {
  taylor<T, Nvar, Ndeg> tmp;
  for (int i = 0; i < tmp.size; i++)
    tmp[i] = t1[i] + t2[i];
  return tmp;
}